

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O0

int pkcs12_pbe_decrypt_init
              (pbe_suite *suite,EVP_CIPHER_CTX *ctx,char *pass,size_t pass_len,CBS *param)

{
  int iVar1;
  size_t sVar2;
  uint8_t *salt_00;
  uint64_t local_60;
  uint64_t iterations;
  CBS salt;
  CBS pbe_param;
  CBS *param_local;
  size_t pass_len_local;
  char *pass_local;
  EVP_CIPHER_CTX *ctx_local;
  pbe_suite *suite_local;
  
  iVar1 = CBS_get_asn1(param,(CBS *)&salt.len,0x20000010);
  if ((((iVar1 != 0) && (iVar1 = CBS_get_asn1((CBS *)&salt.len,(CBS *)&iterations,4), iVar1 != 0))
      && (iVar1 = CBS_get_asn1_uint64((CBS *)&salt.len,&local_60), iVar1 != 0)) &&
     ((sVar2 = CBS_len((CBS *)&salt.len), sVar2 == 0 && (sVar2 = CBS_len(param), sVar2 == 0)))) {
    iVar1 = pkcs12_iterations_acceptable(local_60);
    if (iVar1 == 0) {
      ERR_put_error(0x13,0,0x81,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                    ,0xe1);
      return 0;
    }
    salt_00 = CBS_data((CBS *)&iterations);
    sVar2 = CBS_len((CBS *)&iterations);
    iVar1 = pkcs12_pbe_cipher_init(suite,ctx,(uint32_t)local_60,pass,pass_len,salt_00,sVar2,0);
    return iVar1;
  }
  ERR_put_error(0x13,0,0x68,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                ,0xdc);
  return 0;
}

Assistant:

static int pkcs12_pbe_decrypt_init(const struct pbe_suite *suite,
                                   EVP_CIPHER_CTX *ctx, const char *pass,
                                   size_t pass_len, CBS *param) {
  CBS pbe_param, salt;
  uint64_t iterations;
  if (!CBS_get_asn1(param, &pbe_param, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&pbe_param, &salt, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1_uint64(&pbe_param, &iterations) ||
      CBS_len(&pbe_param) != 0 || CBS_len(param) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  if (!pkcs12_iterations_acceptable(iterations)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  return pkcs12_pbe_cipher_init(suite, ctx, (uint32_t)iterations, pass,
                                pass_len, CBS_data(&salt), CBS_len(&salt),
                                0 /* decrypt */);
}